

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_averages_and_directions.cpp
# Opt level: O1

void compute_avgs_and_dirs_4_comp(partition_info *pi,image_block *blk,partition_metrics *pm)

{
  undefined1 auVar1 [16];
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint8_t (*pauVar5) [216];
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vfloat4 partition_averages [4];
  vfloat4 local_68 [4];
  
  uVar4 = pi->partition_count;
  if ((ulong)uVar4 == 0) {
    __assert_fail("partition_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_averages_and_directions.cpp"
                  ,0x18a,
                  "void compute_avgs_and_dirs_4_comp(const partition_info &, const image_block &, partition_metrics *)"
                 );
  }
  compute_partition_averages_rgba(pi,blk,local_68);
  pauVar5 = pi->texels_of_partition;
  uVar6 = 0;
  do {
    bVar2 = pi->partition_texel_count[uVar6];
    if ((ulong)bVar2 == 0) {
      __assert_fail("texel_count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_averages_and_directions.cpp"
                    ,0x194,
                    "void compute_avgs_and_dirs_4_comp(const partition_info &, const image_block &, partition_metrics *)"
                   );
    }
    auVar1 = *(undefined1 (*) [16])local_68[uVar6].m;
    *(undefined1 (*) [16])pm[uVar6].avg.m = auVar1;
    uVar7 = 0;
    auVar12 = ZEXT816(0) << 0x40;
    auVar13 = ZEXT816(0) << 0x40;
    auVar14 = ZEXT816(0) << 0x40;
    auVar15 = ZEXT816(0) << 0x40;
    do {
      bVar3 = (*pauVar5)[uVar7];
      auVar9 = vinsertps_avx(ZEXT416((uint)blk->data_r[bVar3]),ZEXT416((uint)blk->data_g[bVar3]),
                             0x10);
      auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)blk->data_b[bVar3]),0x20);
      auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)blk->data_a[bVar3]),0x30);
      auVar17 = vsubps_avx(auVar9,auVar1);
      auVar16 = vcmpps_avx(ZEXT816(0) << 0x40,auVar17,1);
      uVar18 = auVar16._0_4_;
      auVar22._4_4_ = uVar18;
      auVar22._0_4_ = uVar18;
      auVar22._8_4_ = uVar18;
      auVar22._12_4_ = uVar18;
      auVar9 = vandps_avx(auVar22,auVar17);
      auVar8._0_4_ = auVar9._0_4_ + auVar12._0_4_;
      auVar8._4_4_ = auVar9._4_4_ + auVar12._4_4_;
      auVar8._8_4_ = auVar9._8_4_ + auVar12._8_4_;
      auVar8._12_4_ = auVar9._12_4_ + auVar12._12_4_;
      auVar12 = vshufps_avx(auVar16,auVar16,0x55);
      auVar12 = vandps_avx(auVar12,auVar17);
      auVar11._0_4_ = auVar12._0_4_ + auVar14._0_4_;
      auVar11._4_4_ = auVar12._4_4_ + auVar14._4_4_;
      auVar11._8_4_ = auVar12._8_4_ + auVar14._8_4_;
      auVar11._12_4_ = auVar12._12_4_ + auVar14._12_4_;
      auVar12 = vshufps_avx(auVar16,auVar16,0xaa);
      auVar12 = vandps_avx(auVar12,auVar17);
      auVar10._0_4_ = auVar12._0_4_ + auVar13._0_4_;
      auVar10._4_4_ = auVar12._4_4_ + auVar13._4_4_;
      auVar10._8_4_ = auVar12._8_4_ + auVar13._8_4_;
      auVar10._12_4_ = auVar12._12_4_ + auVar13._12_4_;
      auVar12 = vshufps_avx(auVar16,auVar16,0xff);
      auVar12 = vandps_avx(auVar12,auVar17);
      auVar9._0_4_ = auVar15._0_4_ + auVar12._0_4_;
      auVar9._4_4_ = auVar15._4_4_ + auVar12._4_4_;
      auVar9._8_4_ = auVar15._8_4_ + auVar12._8_4_;
      auVar9._12_4_ = auVar15._12_4_ + auVar12._12_4_;
      uVar7 = uVar7 + 1;
      auVar12 = auVar8;
      auVar13 = auVar10;
      auVar14 = auVar11;
      auVar15 = auVar9;
    } while (bVar2 != uVar7);
    auVar12._0_4_ = auVar8._0_4_ * auVar8._0_4_;
    auVar12._4_4_ = auVar8._4_4_ * auVar8._4_4_;
    auVar12._8_4_ = auVar8._8_4_ * auVar8._8_4_;
    auVar12._12_4_ = auVar8._12_4_ * auVar8._12_4_;
    auVar1 = vshufpd_avx(auVar12,auVar12,1);
    auVar13._0_4_ = auVar12._0_4_ + auVar1._0_4_;
    auVar13._4_4_ = auVar12._4_4_ + auVar1._4_4_;
    auVar13._8_4_ = auVar12._8_4_ + auVar1._8_4_;
    auVar13._12_4_ = auVar12._12_4_ + auVar1._12_4_;
    auVar1 = vhaddps_avx(auVar13,auVar13);
    auVar15._0_4_ = auVar11._0_4_ * auVar11._0_4_;
    auVar15._4_4_ = auVar11._4_4_ * auVar11._4_4_;
    auVar15._8_4_ = auVar11._8_4_ * auVar11._8_4_;
    auVar15._12_4_ = auVar11._12_4_ * auVar11._12_4_;
    auVar12 = vshufpd_avx(auVar15,auVar15,1);
    auVar16._0_4_ = auVar15._0_4_ + auVar12._0_4_;
    auVar16._4_4_ = auVar15._4_4_ + auVar12._4_4_;
    auVar16._8_4_ = auVar15._8_4_ + auVar12._8_4_;
    auVar16._12_4_ = auVar15._12_4_ + auVar12._12_4_;
    auVar12 = vhaddps_avx(auVar16,auVar16);
    auVar14._0_4_ = auVar1._0_4_;
    auVar14._4_4_ = auVar14._0_4_;
    auVar14._8_4_ = auVar14._0_4_;
    auVar14._12_4_ = auVar14._0_4_;
    auVar19._0_4_ = auVar10._0_4_ * auVar10._0_4_;
    auVar19._4_4_ = auVar10._4_4_ * auVar10._4_4_;
    auVar19._8_4_ = auVar10._8_4_ * auVar10._8_4_;
    auVar19._12_4_ = auVar10._12_4_ * auVar10._12_4_;
    auVar1 = vshufpd_avx(auVar19,auVar19,1);
    auVar20._0_4_ = auVar1._0_4_ + auVar19._0_4_;
    auVar20._4_4_ = auVar1._4_4_ + auVar19._4_4_;
    auVar20._8_4_ = auVar1._8_4_ + auVar19._8_4_;
    auVar20._12_4_ = auVar1._12_4_ + auVar19._12_4_;
    auVar1 = vhaddps_avx(auVar20,auVar20);
    auVar17._0_4_ = auVar12._0_4_;
    auVar17._4_4_ = auVar17._0_4_;
    auVar17._8_4_ = auVar17._0_4_;
    auVar17._12_4_ = auVar17._0_4_;
    auVar21._0_4_ = auVar1._0_4_;
    auVar21._4_4_ = auVar21._0_4_;
    auVar21._8_4_ = auVar21._0_4_;
    auVar21._12_4_ = auVar21._0_4_;
    auVar23._0_4_ = auVar9._0_4_ * auVar9._0_4_;
    auVar23._4_4_ = auVar9._4_4_ * auVar9._4_4_;
    auVar23._8_4_ = auVar9._8_4_ * auVar9._8_4_;
    auVar23._12_4_ = auVar9._12_4_ * auVar9._12_4_;
    auVar1 = vshufpd_avx(auVar23,auVar23,1);
    auVar24._0_4_ = auVar23._0_4_ + auVar1._0_4_;
    auVar24._4_4_ = auVar23._4_4_ + auVar1._4_4_;
    auVar24._8_4_ = auVar23._8_4_ + auVar1._8_4_;
    auVar24._12_4_ = auVar23._12_4_ + auVar1._12_4_;
    auVar1 = vhaddps_avx(auVar24,auVar24);
    auVar25._0_4_ = auVar1._0_4_;
    auVar25._4_4_ = auVar25._0_4_;
    auVar25._8_4_ = auVar25._0_4_;
    auVar25._12_4_ = auVar25._0_4_;
    auVar1 = vcmpps_avx(auVar14,auVar17,1);
    auVar1 = vblendvps_avx(auVar8,auVar11,auVar1);
    auVar13 = vmaxps_avx(auVar17,auVar14);
    auVar12 = vcmpps_avx(auVar13,auVar21,1);
    auVar1 = vblendvps_avx(auVar1,auVar10,auVar12);
    auVar12 = vmaxps_avx(auVar21,auVar13);
    auVar12 = vcmpps_avx(auVar12,auVar25,1);
    auVar1 = vblendvps_avx(auVar1,auVar9,auVar12);
    *(undefined1 (*) [16])pm[uVar6].dir.m = auVar1;
    uVar6 = uVar6 + 1;
    pauVar5 = pauVar5 + 1;
  } while (uVar6 != uVar4);
  return;
}

Assistant:

void compute_avgs_and_dirs_4_comp(
	const partition_info& pi,
	const image_block& blk,
	partition_metrics pm[BLOCK_MAX_PARTITIONS]
) {
	int partition_count = pi.partition_count;
	promise(partition_count > 0);

	// Pre-compute partition_averages
	vfloat4 partition_averages[BLOCK_MAX_PARTITIONS];
	compute_partition_averages_rgba(pi, blk, partition_averages);

	for (int partition = 0; partition < partition_count; partition++)
	{
		const uint8_t *texel_indexes = pi.texels_of_partition[partition];
		unsigned int texel_count = pi.partition_texel_count[partition];
		promise(texel_count > 0);

		vfloat4 average = partition_averages[partition];
		pm[partition].avg = average;

		vfloat4 sum_xp = vfloat4::zero();
		vfloat4 sum_yp = vfloat4::zero();
		vfloat4 sum_zp = vfloat4::zero();
		vfloat4 sum_wp = vfloat4::zero();

		for (unsigned int i = 0; i < texel_count; i++)
		{
			unsigned int iwt = texel_indexes[i];
			vfloat4 texel_datum = blk.texel(iwt);
			texel_datum = texel_datum - average;

			vfloat4 zero = vfloat4::zero();

			vmask4 tdm0 = texel_datum.swz<0,0,0,0>() > zero;
			sum_xp += select(zero, texel_datum, tdm0);

			vmask4 tdm1 = texel_datum.swz<1,1,1,1>() > zero;
			sum_yp += select(zero, texel_datum, tdm1);

			vmask4 tdm2 = texel_datum.swz<2,2,2,2>() > zero;
			sum_zp += select(zero, texel_datum, tdm2);

			vmask4 tdm3 = texel_datum.swz<3,3,3,3>() > zero;
			sum_wp += select(zero, texel_datum, tdm3);
		}

		vfloat4 prod_xp = dot(sum_xp, sum_xp);
		vfloat4 prod_yp = dot(sum_yp, sum_yp);
		vfloat4 prod_zp = dot(sum_zp, sum_zp);
		vfloat4 prod_wp = dot(sum_wp, sum_wp);

		vfloat4 best_vector = sum_xp;
		vfloat4 best_sum = prod_xp;

		vmask4 mask = prod_yp > best_sum;
		best_vector = select(best_vector, sum_yp, mask);
		best_sum = select(best_sum, prod_yp, mask);

		mask = prod_zp > best_sum;
		best_vector = select(best_vector, sum_zp, mask);
		best_sum = select(best_sum, prod_zp, mask);

		mask = prod_wp > best_sum;
		best_vector = select(best_vector, sum_wp, mask);

		pm[partition].dir = best_vector;
	}
}